

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_seekThreeLeavesUnderTheRoot_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_seekThreeLeavesUnderTheRoot_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  value_view v_00;
  value_view v_01;
  bool bVar1;
  const_reference pvVar2;
  key_type kVar3;
  char *pcVar4;
  char *in_R9;
  key_view akey;
  key_view akey_00;
  key_view akey_01;
  key_view akey_02;
  key_view akey_03;
  key_view akey_04;
  key_view akey_05;
  key_view akey_06;
  AssertionResult gtest_ar__28;
  AssertionResult gtest_ar__27;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__26;
  AssertionResult gtest_ar__25;
  iterator it_9;
  bool match_9;
  AssertionResult gtest_ar__24;
  AssertionResult gtest_ar__23;
  iterator it_8;
  bool match_8;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  iterator it_7;
  bool match_7;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar__18;
  iterator it_6;
  bool match_6;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  iterator it_5;
  bool match_5;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  iterator it_4;
  bool match_4;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  iterator it_3;
  bool match_3;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  iterator it_2;
  bool match_2;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  iterator it_1;
  bool match_1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  iterator it;
  bool match;
  uint64_t k2;
  uint64_t k1;
  uint64_t k0;
  TypeParam *db;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  bool debug;
  undefined8 in_stack_ffffffffffffe098;
  undefined7 in_stack_ffffffffffffe0a0;
  undefined1 in_stack_ffffffffffffe0a7;
  string local_1ed8;
  AssertHelper local_1eb8;
  Message local_1eb0;
  bool local_1ea1;
  AssertionResult local_1ea0;
  string local_1e90;
  AssertHelper local_1e70;
  Message local_1e68 [2];
  undefined1 local_1e58 [23];
  bool local_1e41;
  AssertionResult local_1e40;
  AssertHelper local_1e30;
  Message local_1e28;
  key_view local_1e20;
  _Elt_pointer local_1e10;
  AssertionResult local_1e08;
  string local_1df8;
  AssertHelper local_1dd8;
  Message local_1dd0;
  bool local_1dc1;
  AssertionResult local_1dc0;
  string local_1db0;
  AssertHelper local_1d90;
  Message local_1d88;
  bool local_1d79;
  AssertionResult local_1d78;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_1d68;
  iterator local_1d60;
  bool local_1be9;
  string local_1be8;
  AssertHelper local_1bc8;
  Message local_1bc0;
  bool local_1bb1;
  AssertionResult local_1bb0;
  string local_1ba0;
  AssertHelper local_1b80;
  Message local_1b78;
  bool local_1b69;
  AssertionResult local_1b68;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_1b58;
  iterator local_1b50;
  bool local_19d9;
  string local_19d8;
  AssertHelper local_19b8;
  Message local_19b0;
  bool local_19a1;
  AssertionResult local_19a0;
  string local_1990;
  AssertHelper local_1970;
  Message local_1968;
  bool local_1959;
  AssertionResult local_1958;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_1948;
  iterator local_1940;
  bool local_17c9;
  string local_17c8;
  AssertHelper local_17a8;
  Message local_17a0 [2];
  undefined1 local_1790 [23];
  bool local_1779;
  AssertionResult local_1778;
  AssertHelper local_1768;
  Message local_1760;
  key_view local_1758;
  _Elt_pointer local_1748;
  AssertionResult local_1740;
  string local_1730;
  AssertHelper local_1710;
  Message local_1708;
  bool local_16f9;
  AssertionResult local_16f8;
  string local_16e8;
  AssertHelper local_16c8;
  Message local_16c0;
  bool local_16b1;
  AssertionResult local_16b0;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_16a0;
  iterator local_1698;
  bool local_1521;
  string local_1520;
  AssertHelper local_1500;
  Message local_14f8 [2];
  undefined1 local_14e8 [23];
  bool local_14d1;
  AssertionResult local_14d0;
  AssertHelper local_14c0;
  Message local_14b8;
  key_view local_14b0;
  _Elt_pointer local_14a0;
  AssertionResult local_1498;
  string local_1488;
  AssertHelper local_1468;
  Message local_1460;
  AssertionResult local_1458;
  string local_1448;
  AssertHelper local_1428;
  Message local_1420;
  bool local_1411;
  AssertionResult local_1410;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_1400;
  iterator local_13f8;
  bool local_1281;
  string local_1280;
  AssertHelper local_1260;
  Message local_1258 [2];
  undefined1 local_1248 [23];
  bool local_1231;
  AssertionResult local_1230;
  AssertHelper local_1220;
  Message local_1218;
  key_view local_1210;
  _Elt_pointer local_1200;
  AssertionResult local_11f8;
  string local_11e8;
  AssertHelper local_11c8;
  Message local_11c0;
  AssertionResult local_11b8;
  string local_11a8;
  AssertHelper local_1188;
  Message local_1180;
  bool local_1171;
  AssertionResult local_1170;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_1160;
  iterator local_1158;
  bool local_fe1;
  string local_fe0;
  AssertHelper local_fc0;
  Message local_fb8 [2];
  undefined1 local_fa8 [23];
  bool local_f91;
  AssertionResult local_f90;
  AssertHelper local_f80;
  Message local_f78;
  key_view local_f70;
  _Elt_pointer local_f60;
  AssertionResult local_f58;
  string local_f48;
  AssertHelper local_f28;
  Message local_f20;
  AssertionResult local_f18;
  string local_f08;
  AssertHelper local_ee8;
  Message local_ee0;
  bool local_ed1;
  AssertionResult local_ed0;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_ec0;
  iterator local_eb8;
  bool local_d41;
  string local_d40;
  AssertHelper local_d20;
  Message local_d18 [2];
  undefined1 local_d08 [23];
  bool local_cf1;
  AssertionResult local_cf0;
  AssertHelper local_ce0;
  Message local_cd8;
  key_view local_cd0;
  _Elt_pointer local_cc0;
  AssertionResult local_cb8;
  string local_ca8;
  AssertHelper local_c88;
  Message local_c80;
  AssertionResult local_c78;
  string local_c68;
  AssertHelper local_c48;
  Message local_c40;
  bool local_c31;
  AssertionResult local_c30;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_c20;
  iterator local_c18;
  bool local_aa1;
  string local_aa0;
  AssertHelper local_a80;
  Message local_a78 [2];
  undefined1 local_a68 [23];
  bool local_a51;
  AssertionResult local_a50;
  AssertHelper local_a40;
  Message local_a38;
  key_view local_a30;
  _Elt_pointer local_a20;
  AssertionResult local_a18;
  string local_a08;
  AssertHelper local_9e8;
  Message local_9e0;
  AssertionResult local_9d8;
  string local_9c8;
  AssertHelper local_9a8;
  Message local_9a0;
  bool local_991;
  AssertionResult local_990;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_980;
  iterator local_978;
  bool local_801;
  string local_800;
  AssertHelper local_7e0;
  Message local_7d8 [2];
  undefined1 local_7c8 [23];
  bool local_7b1;
  AssertionResult local_7b0;
  AssertHelper local_7a0;
  Message local_798;
  key_view local_790;
  _Elt_pointer local_780;
  AssertionResult local_778;
  string local_768;
  AssertHelper local_748;
  Message local_740;
  AssertionResult local_738;
  string local_728;
  AssertHelper local_708;
  Message local_700;
  bool local_6f1;
  AssertionResult local_6f0;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_6e0;
  iterator local_6d8;
  bool local_561;
  pointer local_560;
  size_t sStack_558;
  pointer local_550;
  size_t sStack_548;
  pointer local_530;
  size_t sStack_528;
  unsigned_long local_520 [3];
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_508;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  undefined1 local_99;
  
  local_99 = 0;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)CONCAT17(in_stack_ffffffffffffe0a7,in_stack_ffffffffffffe0a0),
                  SUB81((ulong)in_stack_ffffffffffffe098 >> 0x38,0));
  local_508 = unodb::test::
              tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::get_db(&local_500);
  local_520[2] = 0xaa10;
  local_520[1] = 0xaa20;
  local_520[0] = 0xaa30;
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_530 = pvVar2->_M_ptr;
  sStack_528 = (pvVar2->_M_extent)._M_extent_value;
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<unsigned_long>(&local_500,0xaa10,v,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_550 = pvVar2->_M_ptr;
  sStack_548 = (pvVar2->_M_extent)._M_extent_value;
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<unsigned_long>(&local_500,0xaa20,v_00,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_560 = pvVar2->_M_ptr;
  sStack_558 = (pvVar2->_M_extent)._M_extent_value;
  v_01._M_ptr = pvVar2->_M_ptr;
  v_01._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<unsigned_long>(&local_500,0xaa30,v_01,false);
  local_561 = false;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_6d8,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>(&local_500,0xaa10);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_6e0.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_6d8,(art_key_type)local_6e0,&local_561,true);
  local_6f1 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(&local_6d8);
  testing::AssertionResult::AssertionResult<bool>(&local_6f0,&local_6f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_728,(internal *)&local_6f0,(AssertionResult *)"it.valid()","false","true",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_728);
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x225,pcVar4);
    testing::internal::AssertHelper::operator=(&local_708,&local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    std::__cxx11::string::~string((string *)&local_728);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult(&local_6f0);
  testing::AssertionResult::AssertionResult<bool>(&local_738,&local_561,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_738);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_768,(internal *)&local_738,(AssertionResult *)0x30452b,"false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_768);
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x226,pcVar4);
    testing::internal::AssertHelper::operator=(&local_748,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    std::__cxx11::string::~string((string *)&local_768);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult(&local_738);
  local_790 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key(&local_6d8);
  akey._M_extent = local_790._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_780 = (_Elt_pointer)decode((anon_unknown_dwarf_d5c8 *)local_790._M_ptr,akey);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_778,"(decode(it.get_key()))","(k0)",(unsigned_long *)&local_780,
             local_520 + 2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_778);
  if (!bVar1) {
    testing::Message::Message(&local_798);
    pcVar4 = testing::AssertionResult::failure_message(&local_778);
    testing::internal::AssertHelper::AssertHelper
              (&local_7a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x227,pcVar4);
    testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
    testing::internal::AssertHelper::~AssertHelper(&local_7a0);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult(&local_778);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_7c8);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_7b1 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_7c8,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_7b0,&local_7b1,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_7c8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7b0);
  if (!bVar1) {
    testing::Message::Message(local_7d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_800,(internal *)&local_7b0,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_800);
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x229,pcVar4);
    testing::internal::AssertHelper::operator=(&local_7e0,local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    std::__cxx11::string::~string((string *)&local_800);
    testing::Message::~Message(local_7d8);
  }
  testing::AssertionResult::~AssertionResult(&local_7b0);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_6d8);
  local_801 = false;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_978,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>(&local_500,0xaa20);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_980.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_978,(art_key_type)local_980,&local_801,true);
  local_991 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(&local_978);
  testing::AssertionResult::AssertionResult<bool>(&local_990,&local_991,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_9c8,(internal *)&local_990,(AssertionResult *)"it.valid()","false","true",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_9c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x230,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9a8,&local_9a0);
    testing::internal::AssertHelper::~AssertHelper(&local_9a8);
    std::__cxx11::string::~string((string *)&local_9c8);
    testing::Message::~Message(&local_9a0);
  }
  testing::AssertionResult::~AssertionResult(&local_990);
  testing::AssertionResult::AssertionResult<bool>(&local_9d8,&local_801,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9d8);
  if (!bVar1) {
    testing::Message::Message(&local_9e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a08,(internal *)&local_9d8,(AssertionResult *)0x30452b,"false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_a08);
    testing::internal::AssertHelper::AssertHelper
              (&local_9e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x231,pcVar4);
    testing::internal::AssertHelper::operator=(&local_9e8,&local_9e0);
    testing::internal::AssertHelper::~AssertHelper(&local_9e8);
    std::__cxx11::string::~string((string *)&local_a08);
    testing::Message::~Message(&local_9e0);
  }
  testing::AssertionResult::~AssertionResult(&local_9d8);
  local_a30 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key(&local_978);
  akey_00._M_extent = local_a30._M_extent._M_extent_value;
  akey_00._M_ptr = (pointer)akey_00._M_extent._M_extent_value;
  local_a20 = (_Elt_pointer)decode((anon_unknown_dwarf_d5c8 *)local_a30._M_ptr,akey_00);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_a18,"(decode(it.get_key()))","(k1)",(unsigned_long *)&local_a20,
             local_520 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a18);
  if (!bVar1) {
    testing::Message::Message(&local_a38);
    pcVar4 = testing::AssertionResult::failure_message(&local_a18);
    testing::internal::AssertHelper::AssertHelper
              (&local_a40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x232,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a40,&local_a38);
    testing::internal::AssertHelper::~AssertHelper(&local_a40);
    testing::Message::~Message(&local_a38);
  }
  testing::AssertionResult::~AssertionResult(&local_a18);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_a68);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_a51 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_a68,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_a50,&local_a51,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_a68)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a50);
  if (!bVar1) {
    testing::Message::Message(local_a78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_aa0,(internal *)&local_a50,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_aa0);
    testing::internal::AssertHelper::AssertHelper
              (&local_a80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x234,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a80,local_a78);
    testing::internal::AssertHelper::~AssertHelper(&local_a80);
    std::__cxx11::string::~string((string *)&local_aa0);
    testing::Message::~Message(local_a78);
  }
  testing::AssertionResult::~AssertionResult(&local_a50);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_978);
  local_aa1 = false;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_c18,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>(&local_500,0xaa30);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_c20.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_c18,(art_key_type)local_c20,&local_aa1,true);
  local_c31 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(&local_c18);
  testing::AssertionResult::AssertionResult<bool>(&local_c30,&local_c31,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c30);
  if (!bVar1) {
    testing::Message::Message(&local_c40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c68,(internal *)&local_c30,(AssertionResult *)"it.valid()","false","true",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_c68);
    testing::internal::AssertHelper::AssertHelper
              (&local_c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c48,&local_c40);
    testing::internal::AssertHelper::~AssertHelper(&local_c48);
    std::__cxx11::string::~string((string *)&local_c68);
    testing::Message::~Message(&local_c40);
  }
  testing::AssertionResult::~AssertionResult(&local_c30);
  testing::AssertionResult::AssertionResult<bool>(&local_c78,&local_aa1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c78);
  if (!bVar1) {
    testing::Message::Message(&local_c80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ca8,(internal *)&local_c78,(AssertionResult *)0x30452b,"false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_ca8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c88,&local_c80);
    testing::internal::AssertHelper::~AssertHelper(&local_c88);
    std::__cxx11::string::~string((string *)&local_ca8);
    testing::Message::~Message(&local_c80);
  }
  testing::AssertionResult::~AssertionResult(&local_c78);
  local_cd0 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key(&local_c18);
  akey_01._M_extent = local_cd0._M_extent._M_extent_value;
  akey_01._M_ptr = (pointer)akey_01._M_extent._M_extent_value;
  local_cc0 = (_Elt_pointer)decode((anon_unknown_dwarf_d5c8 *)local_cd0._M_ptr,akey_01);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_cb8,"(decode(it.get_key()))","(k2)",(unsigned_long *)&local_cc0,
             local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cb8);
  if (!bVar1) {
    testing::Message::Message(&local_cd8);
    pcVar4 = testing::AssertionResult::failure_message(&local_cb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_ce0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_ce0,&local_cd8);
    testing::internal::AssertHelper::~AssertHelper(&local_ce0);
    testing::Message::~Message(&local_cd8);
  }
  testing::AssertionResult::~AssertionResult(&local_cb8);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_d08);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_cf1 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_d08,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_cf0,&local_cf1,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_d08)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cf0);
  if (!bVar1) {
    testing::Message::Message(local_d18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d40,(internal *)&local_cf0,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_d40);
    testing::internal::AssertHelper::AssertHelper
              (&local_d20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x23f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d20,local_d18);
    testing::internal::AssertHelper::~AssertHelper(&local_d20);
    std::__cxx11::string::~string((string *)&local_d40);
    testing::Message::~Message(local_d18);
  }
  testing::AssertionResult::~AssertionResult(&local_cf0);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_c18);
  local_d41 = false;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_eb8,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>(&local_500,0xaa10);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_ec0.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_eb8,(art_key_type)local_ec0,&local_d41,false);
  local_ed1 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid(&local_eb8);
  testing::AssertionResult::AssertionResult<bool>(&local_ed0,&local_ed1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ed0);
  if (!bVar1) {
    testing::Message::Message(&local_ee0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f08,(internal *)&local_ed0,(AssertionResult *)"it.valid()","false","true",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_f08);
    testing::internal::AssertHelper::AssertHelper
              (&local_ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x248,pcVar4);
    testing::internal::AssertHelper::operator=(&local_ee8,&local_ee0);
    testing::internal::AssertHelper::~AssertHelper(&local_ee8);
    std::__cxx11::string::~string((string *)&local_f08);
    testing::Message::~Message(&local_ee0);
  }
  testing::AssertionResult::~AssertionResult(&local_ed0);
  testing::AssertionResult::AssertionResult<bool>(&local_f18,&local_d41,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f18);
  if (!bVar1) {
    testing::Message::Message(&local_f20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f48,(internal *)&local_f18,(AssertionResult *)0x30452b,"false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_f48);
    testing::internal::AssertHelper::AssertHelper
              (&local_f28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x249,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f28,&local_f20);
    testing::internal::AssertHelper::~AssertHelper(&local_f28);
    std::__cxx11::string::~string((string *)&local_f48);
    testing::Message::~Message(&local_f20);
  }
  testing::AssertionResult::~AssertionResult(&local_f18);
  local_f70 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::get_key(&local_eb8);
  akey_02._M_extent = local_f70._M_extent._M_extent_value;
  akey_02._M_ptr = (pointer)akey_02._M_extent._M_extent_value;
  local_f60 = (_Elt_pointer)decode((anon_unknown_dwarf_d5c8 *)local_f70._M_ptr,akey_02);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_f58,"(decode(it.get_key()))","(k0)",(unsigned_long *)&local_f60,
             local_520 + 2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f58);
  if (!bVar1) {
    testing::Message::Message(&local_f78);
    pcVar4 = testing::AssertionResult::failure_message(&local_f58);
    testing::internal::AssertHelper::AssertHelper
              (&local_f80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x24a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f80,&local_f78);
    testing::internal::AssertHelper::~AssertHelper(&local_f80);
    testing::Message::~Message(&local_f78);
  }
  testing::AssertionResult::~AssertionResult(&local_f58);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_fa8);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_f91 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_fa8,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_f90,&local_f91,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_fa8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f90);
  if (!bVar1) {
    testing::Message::Message(local_fb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_fe0,(internal *)&local_f90,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_fe0);
    testing::internal::AssertHelper::AssertHelper
              (&local_fc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x24c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_fc0,local_fb8);
    testing::internal::AssertHelper::~AssertHelper(&local_fc0);
    std::__cxx11::string::~string((string *)&local_fe0);
    testing::Message::~Message(local_fb8);
  }
  testing::AssertionResult::~AssertionResult(&local_f90);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_eb8);
  local_fe1 = false;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_1158,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>(&local_500,0xaa20);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_1160.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_1158,(art_key_type)local_1160,&local_fe1,false);
  local_1171 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid(&local_1158);
  testing::AssertionResult::AssertionResult<bool>(&local_1170,&local_1171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1170);
  if (!bVar1) {
    testing::Message::Message(&local_1180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_11a8,(internal *)&local_1170,(AssertionResult *)"it.valid()","false","true",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_11a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x253,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1188,&local_1180);
    testing::internal::AssertHelper::~AssertHelper(&local_1188);
    std::__cxx11::string::~string((string *)&local_11a8);
    testing::Message::~Message(&local_1180);
  }
  testing::AssertionResult::~AssertionResult(&local_1170);
  testing::AssertionResult::AssertionResult<bool>(&local_11b8,&local_fe1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11b8);
  if (!bVar1) {
    testing::Message::Message(&local_11c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_11e8,(internal *)&local_11b8,(AssertionResult *)0x30452b,"false","true",in_R9)
    ;
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_11e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_11c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x254,pcVar4);
    testing::internal::AssertHelper::operator=(&local_11c8,&local_11c0);
    testing::internal::AssertHelper::~AssertHelper(&local_11c8);
    std::__cxx11::string::~string((string *)&local_11e8);
    testing::Message::~Message(&local_11c0);
  }
  testing::AssertionResult::~AssertionResult(&local_11b8);
  local_1210 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_key(&local_1158);
  akey_03._M_extent = local_1210._M_extent._M_extent_value;
  akey_03._M_ptr = (pointer)akey_03._M_extent._M_extent_value;
  local_1200 = (_Elt_pointer)decode((anon_unknown_dwarf_d5c8 *)local_1210._M_ptr,akey_03);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_11f8,"(decode(it.get_key()))","(k1)",(unsigned_long *)&local_1200,
             local_520 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11f8);
  if (!bVar1) {
    testing::Message::Message(&local_1218);
    pcVar4 = testing::AssertionResult::failure_message(&local_11f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x255,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1220,&local_1218);
    testing::internal::AssertHelper::~AssertHelper(&local_1220);
    testing::Message::~Message(&local_1218);
  }
  testing::AssertionResult::~AssertionResult(&local_11f8);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_1248);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_1231 = std::ranges::__equal_fn::
               operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,(iterator *)local_1248,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_1230,&local_1231,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span
            ((qsbr_ptr_span<const_std::byte> *)local_1248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1230);
  if (!bVar1) {
    testing::Message::Message(local_1258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1280,(internal *)&local_1230,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1280);
    testing::internal::AssertHelper::AssertHelper
              (&local_1260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,599,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1260,local_1258);
    testing::internal::AssertHelper::~AssertHelper(&local_1260);
    std::__cxx11::string::~string((string *)&local_1280);
    testing::Message::~Message(local_1258);
  }
  testing::AssertionResult::~AssertionResult(&local_1230);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_1158);
  local_1281 = false;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_13f8,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<unsigned_long>(&local_500,0xaa30);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_1400.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_13f8,(art_key_type)local_1400,&local_1281,false);
  local_1411 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid(&local_13f8);
  testing::AssertionResult::AssertionResult<bool>(&local_1410,&local_1411,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1410);
  if (!bVar1) {
    testing::Message::Message(&local_1420);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1448,(internal *)&local_1410,(AssertionResult *)"it.valid()","false","true",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1448);
    testing::internal::AssertHelper::AssertHelper
              (&local_1428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x25e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1428,&local_1420);
    testing::internal::AssertHelper::~AssertHelper(&local_1428);
    std::__cxx11::string::~string((string *)&local_1448);
    testing::Message::~Message(&local_1420);
  }
  testing::AssertionResult::~AssertionResult(&local_1410);
  testing::AssertionResult::AssertionResult<bool>(&local_1458,&local_1281,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1458);
  if (!bVar1) {
    testing::Message::Message(&local_1460);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1488,(internal *)&local_1458,(AssertionResult *)0x30452b,"false","true",in_R9)
    ;
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1488);
    testing::internal::AssertHelper::AssertHelper
              (&local_1468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x25f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1468,&local_1460);
    testing::internal::AssertHelper::~AssertHelper(&local_1468);
    std::__cxx11::string::~string((string *)&local_1488);
    testing::Message::~Message(&local_1460);
  }
  testing::AssertionResult::~AssertionResult(&local_1458);
  local_14b0 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_key(&local_13f8);
  akey_04._M_extent = local_14b0._M_extent._M_extent_value;
  akey_04._M_ptr = (pointer)akey_04._M_extent._M_extent_value;
  local_14a0 = (_Elt_pointer)decode((anon_unknown_dwarf_d5c8 *)local_14b0._M_ptr,akey_04);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_1498,"(decode(it.get_key()))","(k2)",(unsigned_long *)&local_14a0,
             local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1498);
  if (!bVar1) {
    testing::Message::Message(&local_14b8);
    pcVar4 = testing::AssertionResult::failure_message(&local_1498);
    testing::internal::AssertHelper::AssertHelper
              (&local_14c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x260,pcVar4);
    testing::internal::AssertHelper::operator=(&local_14c0,&local_14b8);
    testing::internal::AssertHelper::~AssertHelper(&local_14c0);
    testing::Message::~Message(&local_14b8);
  }
  testing::AssertionResult::~AssertionResult(&local_1498);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_14e8);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_14d1 = std::ranges::__equal_fn::
               operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,(iterator *)local_14e8,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_14d0,&local_14d1,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span
            ((qsbr_ptr_span<const_std::byte> *)local_14e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_14d0);
  if (!bVar1) {
    testing::Message::Message(local_14f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1520,(internal *)&local_14d0,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1520);
    testing::internal::AssertHelper::AssertHelper
              (&local_1500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x262,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1500,local_14f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1500);
    std::__cxx11::string::~string((string *)&local_1520);
    testing::Message::~Message(local_14f8);
  }
  testing::AssertionResult::~AssertionResult(&local_14d0);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_13f8);
  local_1521 = true;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_1698,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>(&local_500,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_16a0.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_1698,(art_key_type)local_16a0,&local_1521,true);
  local_16b1 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid(&local_1698);
  testing::AssertionResult::AssertionResult<bool>(&local_16b0,&local_16b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_16b0);
  if (!bVar1) {
    testing::Message::Message(&local_16c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_16e8,(internal *)&local_16b0,(AssertionResult *)"it.valid()","false","true",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_16e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_16c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x271,pcVar4);
    testing::internal::AssertHelper::operator=(&local_16c8,&local_16c0);
    testing::internal::AssertHelper::~AssertHelper(&local_16c8);
    std::__cxx11::string::~string((string *)&local_16e8);
    testing::Message::~Message(&local_16c0);
  }
  testing::AssertionResult::~AssertionResult(&local_16b0);
  local_16f9 = (bool)(~local_1521 & 1);
  testing::AssertionResult::AssertionResult<bool>(&local_16f8,&local_16f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_16f8);
  if (!bVar1) {
    testing::Message::Message(&local_1708);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1730,(internal *)&local_16f8,(AssertionResult *)0x30452b,"true","false",in_R9)
    ;
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1730);
    testing::internal::AssertHelper::AssertHelper
              (&local_1710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x272,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1710,&local_1708);
    testing::internal::AssertHelper::~AssertHelper(&local_1710);
    std::__cxx11::string::~string((string *)&local_1730);
    testing::Message::~Message(&local_1708);
  }
  testing::AssertionResult::~AssertionResult(&local_16f8);
  local_1758 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_key(&local_1698);
  akey_05._M_extent = local_1758._M_extent._M_extent_value;
  akey_05._M_ptr = (pointer)akey_05._M_extent._M_extent_value;
  local_1748 = (_Elt_pointer)decode((anon_unknown_dwarf_d5c8 *)local_1758._M_ptr,akey_05);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_1740,"(decode(it.get_key()))","(k0)",(unsigned_long *)&local_1748,
             local_520 + 2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1740);
  if (!bVar1) {
    testing::Message::Message(&local_1760);
    pcVar4 = testing::AssertionResult::failure_message(&local_1740);
    testing::internal::AssertHelper::AssertHelper
              (&local_1768,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x273,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1768,&local_1760);
    testing::internal::AssertHelper::~AssertHelper(&local_1768);
    testing::Message::~Message(&local_1760);
  }
  testing::AssertionResult::~AssertionResult(&local_1740);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_1790);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_1779 = std::ranges::__equal_fn::
               operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,(iterator *)local_1790,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_1778,&local_1779,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span
            ((qsbr_ptr_span<const_std::byte> *)local_1790);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1778);
  if (!bVar1) {
    testing::Message::Message(local_17a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_17c8,(internal *)&local_1778,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_17c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_17a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x275,pcVar4);
    testing::internal::AssertHelper::operator=(&local_17a8,local_17a0);
    testing::internal::AssertHelper::~AssertHelper(&local_17a8);
    std::__cxx11::string::~string((string *)&local_17c8);
    testing::Message::~Message(local_17a0);
  }
  testing::AssertionResult::~AssertionResult(&local_1778);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_1698);
  local_17c9 = true;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_1940,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>(&local_500,0xffff);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_1948.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_1940,(art_key_type)local_1948,&local_17c9,true);
  local_1959 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid(&local_1940);
  local_1959 = !local_1959;
  testing::AssertionResult::AssertionResult<bool>(&local_1958,&local_1959,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1958);
  if (!bVar1) {
    testing::Message::Message(&local_1968);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1990,(internal *)&local_1958,(AssertionResult *)"it.valid()","true","false",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1990);
    testing::internal::AssertHelper::AssertHelper
              (&local_1970,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x281,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1970,&local_1968);
    testing::internal::AssertHelper::~AssertHelper(&local_1970);
    std::__cxx11::string::~string((string *)&local_1990);
    testing::Message::~Message(&local_1968);
  }
  testing::AssertionResult::~AssertionResult(&local_1958);
  local_19a1 = (bool)(~local_17c9 & 1);
  testing::AssertionResult::AssertionResult<bool>(&local_19a0,&local_19a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_19a0);
  if (!bVar1) {
    testing::Message::Message(&local_19b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_19d8,(internal *)&local_19a0,(AssertionResult *)0x30452b,"true","false",in_R9)
    ;
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_19d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_19b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x282,pcVar4);
    testing::internal::AssertHelper::operator=(&local_19b8,&local_19b0);
    testing::internal::AssertHelper::~AssertHelper(&local_19b8);
    std::__cxx11::string::~string((string *)&local_19d8);
    testing::Message::~Message(&local_19b0);
  }
  testing::AssertionResult::~AssertionResult(&local_19a0);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_1940);
  local_19d9 = true;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_1b50,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>(&local_500,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_1b58.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_1b50,(art_key_type)local_1b58,&local_19d9,false);
  local_1b69 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid(&local_1b50);
  local_1b69 = !local_1b69;
  testing::AssertionResult::AssertionResult<bool>(&local_1b68,&local_1b69,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b68);
  if (!bVar1) {
    testing::Message::Message(&local_1b78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1ba0,(internal *)&local_1b68,(AssertionResult *)"it.valid()","true","false",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1ba0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x28f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b80,&local_1b78);
    testing::internal::AssertHelper::~AssertHelper(&local_1b80);
    std::__cxx11::string::~string((string *)&local_1ba0);
    testing::Message::~Message(&local_1b78);
  }
  testing::AssertionResult::~AssertionResult(&local_1b68);
  local_1bb1 = (bool)(~local_19d9 & 1);
  testing::AssertionResult::AssertionResult<bool>(&local_1bb0,&local_1bb1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1bb0);
  if (!bVar1) {
    testing::Message::Message(&local_1bc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1be8,(internal *)&local_1bb0,(AssertionResult *)0x30452b,"true","false",in_R9)
    ;
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1be8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1bc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x290,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1bc8,&local_1bc0);
    testing::internal::AssertHelper::~AssertHelper(&local_1bc8);
    std::__cxx11::string::~string((string *)&local_1be8);
    testing::Message::~Message(&local_1bc0);
  }
  testing::AssertionResult::~AssertionResult(&local_1bb0);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_1b50);
  local_1be9 = true;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  test_only_iterator(&local_1d60,local_508);
  kVar3 = unodb::test::
          tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>(&local_500,0xffff);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_1d68.key_bytes,kVar3);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            (&local_1d60,(art_key_type)local_1d68,&local_1be9,false);
  local_1d79 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid(&local_1d60);
  testing::AssertionResult::AssertionResult<bool>(&local_1d78,&local_1d79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d78);
  if (!bVar1) {
    testing::Message::Message(&local_1d88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1db0,(internal *)&local_1d78,(AssertionResult *)"it.valid()","false","true",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1db0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x29c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d90,&local_1d88);
    testing::internal::AssertHelper::~AssertHelper(&local_1d90);
    std::__cxx11::string::~string((string *)&local_1db0);
    testing::Message::~Message(&local_1d88);
  }
  testing::AssertionResult::~AssertionResult(&local_1d78);
  local_1dc1 = (bool)(~local_1be9 & 1);
  testing::AssertionResult::AssertionResult<bool>(&local_1dc0,&local_1dc1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1dc0);
  if (!bVar1) {
    testing::Message::Message(&local_1dd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1df8,(internal *)&local_1dc0,(AssertionResult *)0x30452b,"true","false",in_R9)
    ;
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1df8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1dd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x29d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1dd8,&local_1dd0);
    testing::internal::AssertHelper::~AssertHelper(&local_1dd8);
    std::__cxx11::string::~string((string *)&local_1df8);
    testing::Message::~Message(&local_1dd0);
  }
  testing::AssertionResult::~AssertionResult(&local_1dc0);
  local_1e20 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::get_key(&local_1d60);
  akey_06._M_extent = local_1e20._M_extent._M_extent_value;
  akey_06._M_ptr = (pointer)akey_06._M_extent._M_extent_value;
  local_1e10 = (_Elt_pointer)decode((anon_unknown_dwarf_d5c8 *)local_1e20._M_ptr,akey_06);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_1e08,"(decode(it.get_key()))","(k2)",(unsigned_long *)&local_1e10,
             local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e08);
  if (!bVar1) {
    testing::Message::Message(&local_1e28);
    pcVar4 = testing::AssertionResult::failure_message(&local_1e08);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x29e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1e30,&local_1e28);
    testing::internal::AssertHelper::~AssertHelper(&local_1e30);
    testing::Message::~Message(&local_1e28);
  }
  testing::AssertionResult::~AssertionResult(&local_1e08);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  get_val((iterator *)local_1e58);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  local_1e41 = std::ranges::__equal_fn::
               operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,(iterator *)local_1e58,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_1e40,&local_1e41,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span
            ((qsbr_ptr_span<const_std::byte> *)local_1e58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e40);
  if (!bVar1) {
    testing::Message::Message(local_1e68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e90,(internal *)&local_1e40,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[2])",
               "false","true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1e90);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x2a0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1e70,local_1e68);
    testing::internal::AssertHelper::~AssertHelper(&local_1e70);
    std::__cxx11::string::~string((string *)&local_1e90);
    testing::Message::~Message(local_1e68);
  }
  testing::AssertionResult::~AssertionResult(&local_1e40);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            (&local_1d60);
  local_1ea1 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               iterator::valid(&local_1d60);
  local_1ea1 = !local_1ea1;
  testing::AssertionResult::AssertionResult<bool>(&local_1ea0,&local_1ea1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1ea0);
  if (!bVar1) {
    testing::Message::Message(&local_1eb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1ed8,(internal *)&local_1ea0,(AssertionResult *)"it.valid()","true","false",
               in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_1ed8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1eb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x2a2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1eb8,&local_1eb0);
    testing::internal::AssertHelper::~AssertHelper(&local_1eb8);
    std::__cxx11::string::~string((string *)&local_1ed8);
    testing::Message::~Message(&local_1eb0);
  }
  testing::AssertionResult::~AssertionResult(&local_1ea0);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  ~iterator(&local_1d60);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, seekThreeLeavesUnderTheRoot) {
  constexpr bool debug = false;
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();
  constexpr std::uint64_t k0 = 0xaa10;
  constexpr std::uint64_t k1 = 0xaa20;
  constexpr std::uint64_t k2 = 0xaa30;
  verifier.insert(k0, unodb::test::test_values[0]);
  verifier.insert(k1, unodb::test::test_values[1]);
  verifier.insert(k2, unodb::test::test_values[2]);
  if (debug) {
    std::cerr << "db state::\n";
    db.dump(std::cerr);
  }
  {    // exact match, forward traversal
    {  // exact match, forward traversal (GTE), first key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, forward traversal (GTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, forward traversal (GTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // exact match, reverse traversal
    {  // exact match, reverse traversal (LTE), first key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, reverse traversal (LTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, reverse traversal (LTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // before and after the first and last key
    {  // forward traversal, before the first key in the data.
      // match=false and iterator is positioned on the first key in the
      // data.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
              true /*fwd*/);
      if (debug) {
        std::cerr << "it.seek(0,&match,true)::\n";
        it.dump(std::cerr);
      }
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_FALSE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // forward traversal, after the last key in the data.
       // match=false and iterator is invalidated.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
              match, true /*fwd*/);
      if (debug) {
        std::cerr << "it.seek(0xffff,&match,true)::\n";
        it.dump(std::cerr);
      }
      UNODB_EXPECT_FALSE(it.valid());
      UNODB_EXPECT_FALSE(match);
    }
    {
      {  // reverse traversal, before the first key in the data.
        // match=false and iterator is invalidated.
        bool match = true;
        auto it = db.test_only_iterator();
        it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)},
                match, false /*fwd*/);
        if (debug) {
          std::cerr << "it.seek(0,&match,true)::\n";
          it.dump(std::cerr);
        }
        UNODB_EXPECT_FALSE(it.valid());
        UNODB_EXPECT_FALSE(match);
      }
      {  // reverse traversal, after the last key in the data.
         // match=false and iterator is positioned at the last key.
        bool match = true;
        auto it = db.test_only_iterator();
        it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
                match, false /*fwd*/);
        if (debug) {
          std::cerr << "it.seek(0xffff,&match,false)::\n";
          it.dump(std::cerr);
        }
        UNODB_EXPECT_TRUE(it.valid());
        UNODB_EXPECT_FALSE(match);
        UNODB_EXPECT_EQ(decode(it.get_key()), k2);
        UNODB_EXPECT_TRUE(
            std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
        it.next();
        UNODB_EXPECT_FALSE(it.valid());
      }
    }
  }
}